

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  ArenaImpl *this_00;
  int iVar1;
  Extension *pEVar2;
  string *this_01;
  Type *pTVar3;
  undefined4 extraout_var;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar4;
  
  pVar4 = Insert(this,number);
  pEVar2 = pVar4.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    this_01 = (pEVar2->field_0).string_value;
  }
  else {
    pEVar2->type = type;
    pEVar2->is_repeated = true;
    this_00 = (ArenaImpl *)this->arena_;
    if (this_00 == (ArenaImpl *)0x0) {
      this_01 = (string *)operator_new(0x18);
      (this_01->_M_dataplus)._M_p = (pointer)0x0;
      this_01->_M_string_length = 0;
      (this_01->field_2)._M_allocated_capacity = 0;
    }
    else {
      ArenaImpl::RecordAlloc
                (this_00,(type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,
                 0x18);
      this_01 = (string *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (this_00,0x18,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                          );
      (this_01->_M_dataplus)._M_p = (pointer)this_00;
      this_01->_M_string_length = 0;
      (this_01->field_2)._M_allocated_capacity = 0;
    }
    (pEVar2->field_0).repeated_string_value =
         (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this_01;
  }
  pTVar3 = RepeatedPtrFieldBase::
           AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                     ((RepeatedPtrFieldBase *)this_01);
  if (pTVar3 == (Type *)0x0) {
    iVar1 = (*prototype->_vptr_MessageLite[4])(prototype,this->arena_);
    pTVar3 = (Type *)CONCAT44(extraout_var,iVar1);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar2->field_0).int64_value,pTVar3);
  }
  return pTVar3;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  // RepeatedPtrField<MessageLite> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                            extension->repeated_message_value)
                            ->AddFromCleared<GenericTypeHandler<MessageLite>>();
  if (result == NULL) {
    result = prototype.New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}